

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::TestCaseInfo::TestCaseInfo
          (TestCaseInfo *this,StringRef _className,NameAndTags *_nameAndTags,
          SourceLineInfo *_lineInfo)

{
  undefined8 uVar1;
  StringRef filepath;
  StringRef tagStr_00;
  StringRef tagStr_01;
  StringRef tag;
  StringRef tag_00;
  ulong uVar2;
  bool bVar3;
  TestCaseProperties rhs;
  char cVar4;
  undefined1 uVar5;
  size_type sVar6;
  size_t sVar7;
  iterator __first;
  iterator __first_00;
  StringRef *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  const_iterator __last;
  undefined8 *in_R8;
  StringRef tagStr;
  char c;
  size_t idx;
  bool inTag;
  size_t tagEnd;
  size_t tagStart;
  unsigned_long requiredSize;
  StringRef originalTags;
  string *in_stack_fffffffffffffcc8;
  ReusableStringStream *in_stack_fffffffffffffcd0;
  __normal_iterator<Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
  in_stack_fffffffffffffcd8;
  __normal_iterator<Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
  in_stack_fffffffffffffce0;
  char *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf0;
  TestCaseInfo *in_stack_fffffffffffffd00;
  StringRef *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  size_type in_stack_fffffffffffffd18;
  SourceLineInfo *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  size_type in_stack_fffffffffffffd50;
  StringRef local_138 [7];
  char local_c1;
  ulong local_c0;
  byte local_b1;
  size_type local_b0;
  size_type local_a8;
  long local_90;
  StringRef local_88 [2];
  byte local_59;
  string local_58 [32];
  char *local_38;
  size_type local_30;
  undefined8 *local_28;
  StringRef *local_20;
  undefined8 local_10;
  undefined8 uStack_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  uStack_8 = in_RDX;
  bVar3 = StringRef::empty(in_RCX);
  local_59 = 0;
  if (bVar3) {
    (anonymous_namespace)::makeDefaultName_abi_cxx11_();
    local_59 = 1;
    StringRef::StringRef((StringRef *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  }
  else {
    local_38 = local_20->m_start;
    local_30 = local_20->m_size;
  }
  StringRef::operator_cast_to_string(in_stack_fffffffffffffd08);
  if ((local_59 & 1) != 0) {
    std::__cxx11::string::~string(local_58);
  }
  *(undefined8 *)(in_RDI + 0x20) = local_10;
  *(undefined8 *)(in_RDI + 0x28) = uStack_8;
  std::__cxx11::string::string((string *)(in_RDI + 0x30));
  std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::vector
            ((vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)0x180463);
  uVar1 = local_28[1];
  *(undefined8 *)(in_RDI + 0x68) = *local_28;
  *(undefined8 *)(in_RDI + 0x70) = uVar1;
  *(undefined1 *)(in_RDI + 0x78) = 0;
  local_88[0].m_start = local_20[1].m_start;
  local_88[0].m_size = local_20[1].m_size;
  sVar6 = StringRef::size(local_88);
  StringRef::StringRef
            (&(in_stack_fffffffffffffce0._M_current)->original,
             (char *)in_stack_fffffffffffffcd8._M_current);
  filepath.m_size = (size_type)in_stack_fffffffffffffcf0;
  filepath.m_start = in_stack_fffffffffffffce8;
  sVar7 = anon_unknown_26::sizeOfExtraTags(filepath);
  local_90 = sVar6 + sVar7;
  std::__cxx11::string::reserve(in_RDI + 0x30);
  local_a8 = 0;
  local_b0 = 0;
  local_b1 = 0;
  local_c0 = 0;
  do {
    uVar2 = local_c0;
    sVar6 = StringRef::size(local_88);
    if (sVar6 <= uVar2) {
      if ((local_b1 & 1) == 0) {
        uVar5 = isHidden((TestCaseInfo *)0x180bd2);
        if ((bool)uVar5) {
          operator____sr((char *)in_stack_fffffffffffffcd0,(size_t)in_stack_fffffffffffffcc8);
          tagStr_01.m_size._0_7_ = in_stack_fffffffffffffd10;
          tagStr_01.m_start = (char *)in_stack_fffffffffffffd08;
          tagStr_01.m_size._7_1_ = uVar5;
          internalAppendTag(in_stack_fffffffffffffd00,tagStr_01);
        }
        std::begin<std::vector<Catch::Tag,std::allocator<Catch::Tag>>>
                  ((vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)in_stack_fffffffffffffcc8);
        std::end<std::vector<Catch::Tag,std::allocator<Catch::Tag>>>
                  ((vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)in_stack_fffffffffffffcc8);
        std::
        sort<__gnu_cxx::__normal_iterator<Catch::Tag*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>>
                  (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        __last._M_current = (Tag *)(in_RDI + 0x50);
        __first = std::begin<std::vector<Catch::Tag,std::allocator<Catch::Tag>>>
                            ((vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)
                             in_stack_fffffffffffffcc8);
        __first_00 = std::end<std::vector<Catch::Tag,std::allocator<Catch::Tag>>>
                               ((vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)
                                in_stack_fffffffffffffcc8);
        std::
        unique<__gnu_cxx::__normal_iterator<Catch::Tag*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>>
                  ((__normal_iterator<Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                    )__first_00._M_current,in_stack_fffffffffffffce0);
        __gnu_cxx::
        __normal_iterator<Catch::Tag_const*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>::
        __normal_iterator<Catch::Tag*>
                  ((__normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                    *)in_stack_fffffffffffffcd0,
                   (__normal_iterator<Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                    *)in_stack_fffffffffffffcc8);
        std::end<std::vector<Catch::Tag,std::allocator<Catch::Tag>>>
                  ((vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)in_stack_fffffffffffffcc8);
        __gnu_cxx::
        __normal_iterator<Catch::Tag_const*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>::
        __normal_iterator<Catch::Tag*>
                  ((__normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                    *)in_stack_fffffffffffffcd0,
                   (__normal_iterator<Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                    *)in_stack_fffffffffffffcc8);
        std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::erase
                  ((vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)__first_00._M_current,
                   (const_iterator)__first._M_current,__last);
        return;
      }
      ReusableStringStream::ReusableStringStream(in_stack_fffffffffffffcd0);
      ReusableStringStream::operator<<
                (in_stack_fffffffffffffcd0,(char (*) [52])in_stack_fffffffffffffcc8);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffce0._M_current,
                 &(in_stack_fffffffffffffcd8._M_current)->original);
      ReusableStringStream::operator<<
                (in_stack_fffffffffffffcd0,(char (*) [6])in_stack_fffffffffffffcc8);
      ReusableStringStream::operator<<
                (in_stack_fffffffffffffcd0,(SourceLineInfo *)in_stack_fffffffffffffcc8);
      ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffcc8);
      throw_domain_error(in_stack_fffffffffffffcf0);
    }
    local_c1 = StringRef::operator[](local_88,local_c0);
    if (local_c1 == '[') {
      if ((local_b1 & 1) != 0) {
        ReusableStringStream::ReusableStringStream(in_stack_fffffffffffffcd0);
        ReusableStringStream::operator<<
                  (in_stack_fffffffffffffcd0,(char (*) [53])in_stack_fffffffffffffcc8);
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffce0._M_current,
                   &(in_stack_fffffffffffffcd8._M_current)->original);
        ReusableStringStream::operator<<
                  (in_stack_fffffffffffffcd0,(char (*) [6])in_stack_fffffffffffffcc8);
        ReusableStringStream::operator<<
                  (in_stack_fffffffffffffcd0,(SourceLineInfo *)in_stack_fffffffffffffcc8);
        ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffcc8);
        throw_domain_error(in_stack_fffffffffffffcf0);
      }
      local_b1 = 1;
      local_a8 = local_c0;
    }
    if (local_c1 == ']') {
      if ((local_b1 & 1) == 0) {
        ReusableStringStream::ReusableStringStream(in_stack_fffffffffffffcd0);
        ReusableStringStream::operator<<
                  (in_stack_fffffffffffffcd0,(char (*) [50])in_stack_fffffffffffffcc8);
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffce0._M_current,
                   &(in_stack_fffffffffffffcd8._M_current)->original);
        ReusableStringStream::operator<<
                  (in_stack_fffffffffffffcd0,(char (*) [6])in_stack_fffffffffffffcc8);
        ReusableStringStream::operator<<
                  (in_stack_fffffffffffffcd0,(SourceLineInfo *)in_stack_fffffffffffffcc8);
        ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffcc8);
        throw_domain_error(in_stack_fffffffffffffcf0);
      }
      local_b1 = 0;
      local_b0 = local_c0;
      local_138[0] = StringRef::substr((StringRef *)in_stack_fffffffffffffcf0,
                                       (size_type)in_stack_fffffffffffffce8,
                                       (size_type)in_stack_fffffffffffffce0._M_current);
      bVar3 = StringRef::empty(local_138);
      if (bVar3) {
        ReusableStringStream::ReusableStringStream(in_stack_fffffffffffffcd0);
        ReusableStringStream::operator<<
                  (in_stack_fffffffffffffcd0,(char (*) [49])in_stack_fffffffffffffcc8);
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffce0._M_current,
                   &(in_stack_fffffffffffffcd8._M_current)->original);
        ReusableStringStream::operator<<
                  (in_stack_fffffffffffffcd0,(char (*) [6])in_stack_fffffffffffffcc8);
        ReusableStringStream::operator<<
                  (in_stack_fffffffffffffcd0,(SourceLineInfo *)in_stack_fffffffffffffcc8);
        ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffcc8);
        throw_domain_error(in_stack_fffffffffffffcf0);
      }
      tag_00.m_size = in_stack_fffffffffffffd50;
      tag_00.m_start = in_stack_fffffffffffffd48;
      anon_unknown_26::enforceNotReservedTag(tag_00,in_stack_fffffffffffffd40);
      tag.m_start._7_1_ = in_stack_fffffffffffffd17;
      tag.m_start._0_7_ = in_stack_fffffffffffffd10;
      tag.m_size = in_stack_fffffffffffffd18;
      rhs = anon_unknown_26::parseSpecialTag(tag);
      anon_unknown_26::operator|=((TestCaseProperties *)(in_RDI + 0x78),rhs);
      sVar6 = StringRef::size(local_138);
      if ((1 < sVar6) && (cVar4 = StringRef::operator[](local_138,0), cVar4 == '.')) {
        StringRef::size(local_138);
        local_138[0] = StringRef::substr((StringRef *)in_stack_fffffffffffffcf0,
                                         (size_type)in_stack_fffffffffffffce8,
                                         (size_type)in_stack_fffffffffffffce0._M_current);
      }
      tagStr_00.m_size._0_7_ = in_stack_fffffffffffffd10;
      tagStr_00.m_start = (char *)in_stack_fffffffffffffd08;
      tagStr_00.m_size._7_1_ = in_stack_fffffffffffffd17;
      internalAppendTag(in_stack_fffffffffffffd00,tagStr_00);
    }
    local_c0 = local_c0 + 1;
  } while( true );
}

Assistant:

TestCaseInfo::TestCaseInfo(StringRef _className,
                               NameAndTags const& _nameAndTags,
                               SourceLineInfo const& _lineInfo):
        name( _nameAndTags.name.empty() ? makeDefaultName() : _nameAndTags.name ),
        className( _className ),
        lineInfo( _lineInfo )
    {
        StringRef originalTags = _nameAndTags.tags;
        // We need to reserve enough space to store all of the tags
        // (including optional hidden tag and filename tag)
        auto requiredSize = originalTags.size() + sizeOfExtraTags(_lineInfo.file);
        backingTags.reserve(requiredSize);

        // We cannot copy the tags directly, as we need to normalize
        // some tags, so that [.foo] is copied as [.][foo].
        size_t tagStart = 0;
        size_t tagEnd = 0;
        bool inTag = false;
        for (size_t idx = 0; idx < originalTags.size(); ++idx) {
            auto c = originalTags[idx];
            if (c == '[') {
                CATCH_ENFORCE(
                    !inTag,
                    "Found '[' inside a tag while registering test case '"
                        << _nameAndTags.name << "' at " << _lineInfo );

                inTag = true;
                tagStart = idx;
            }
            if (c == ']') {
                CATCH_ENFORCE(
                    inTag,
                    "Found unmatched ']' while registering test case '"
                        << _nameAndTags.name << "' at " << _lineInfo );

                inTag = false;
                tagEnd = idx;
                assert(tagStart < tagEnd);

                // We need to check the tag for special meanings, copy
                // it over to backing storage and actually reference the
                // backing storage in the saved tags
                StringRef tagStr = originalTags.substr(tagStart+1, tagEnd - tagStart - 1);
                CATCH_ENFORCE( !tagStr.empty(),
                               "Found an empty tag while registering test case '"
                                   << _nameAndTags.name << "' at "
                                   << _lineInfo );

                enforceNotReservedTag(tagStr, lineInfo);
                properties |= parseSpecialTag(tagStr);
                // When copying a tag to the backing storage, we need to
                // check if it is a merged hide tag, such as [.foo], and
                // if it is, we need to handle it as if it was [foo].
                if (tagStr.size() > 1 && tagStr[0] == '.') {
                    tagStr = tagStr.substr(1, tagStr.size() - 1);
                }
                // We skip over dealing with the [.] tag, as we will add
                // it later unconditionally and then sort and unique all
                // the tags.
                internalAppendTag(tagStr);
            }
        }
        CATCH_ENFORCE( !inTag,
                       "Found an unclosed tag while registering test case '"
                           << _nameAndTags.name << "' at " << _lineInfo );


        // Add [.] if relevant
        if (isHidden()) {
            internalAppendTag("."_sr);
        }

        // Sort and prepare tags
        std::sort(begin(tags), end(tags));
        tags.erase(std::unique(begin(tags), end(tags)),
                   end(tags));
    }